

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O2

void __thiscall libchars::edit_object::emptied(edit_object *this)

{
  return;
}

Assistant:

virtual void set(const char *line, size_t idx = std::string::npos)
        {
            if (line != NULL) {
                size_t L = buflen;
                strncpy(buffer,line,sizeof(buffer)-1);
                buffer[sizeof(buffer) - 1] = 0;
                buflen = strlen(buffer);

                if (idx <= buflen)
                    insert_idx = idx;
                else
                    insert_idx = buflen;

                if (L > 0 && buflen == 0)
                    emptied();
            }
            else {
                insert_idx = 0;
                wipe();
            }
        }